

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_TooLongNamesCauseABuildError_Test::
~ValidationErrorTest_TooLongNamesCauseABuildError_Test
          (ValidationErrorTest_TooLongNamesCauseABuildError_Test *this)

{
  ValidationErrorTest::~ValidationErrorTest(&this->super_ValidationErrorTest);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, TooLongNamesCauseABuildError) {
  FileDescriptorProto file_proto;
  ASSERT_TRUE(TextFormat::ParseFromString(
      R"pb(
        name: "foo.proto"
        message_type {
          name: "Foo"
          field { name: "name" number: 1 type: TYPE_STRING }
        }
      )pb",
      &file_proto));

  // Grow package.
  TestNameSizeLimit(file_proto, *file_proto.mutable_package(), "package");

  // Grow message name.
  TestNameSizeLimit(file_proto,
                    *file_proto.mutable_message_type(0)->mutable_name(),
                    "message");

  // Grow field name.
  TestNameSizeLimit(
      file_proto,
      *file_proto.mutable_message_type(0)->mutable_field(0)->mutable_name(),
      "field");

  // Grow field json_name.
  TestNameSizeLimit(file_proto,
                    *file_proto.mutable_message_type(0)
                         ->mutable_field(0)
                         ->mutable_json_name(),
                    "json_name");
}